

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMerge.c
# Opt level: O1

void Nwk_ManGraphListExtract(Nwk_Grf_t *p,Nwk_Vrt_t *pVertex)

{
  int iVar1;
  int iVar2;
  Nwk_Vrt_t **ppNVar3;
  long lVar4;
  
  iVar1 = pVertex->nEdges;
  lVar4 = (long)iVar1;
  if (lVar4 < 1) {
    __assert_fail("pVertex->nEdges > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkMerge.c"
                  ,0xf6,"void Nwk_ManGraphListExtract(Nwk_Grf_t *, Nwk_Vrt_t *)");
  }
  if (iVar1 == 1) {
    ppNVar3 = p->pVerts;
    lVar4 = (long)ppNVar3[pVertex[1].Id]->nEdges;
    if (lVar4 < 0x10) {
      if (p->pLists1[lVar4] == 0) goto LAB_00496a1f;
      iVar1 = pVertex->iPrev;
      if ((long)iVar1 != 0) {
        ppNVar3[iVar1]->iNext = pVertex->iNext;
      }
      iVar2 = pVertex->iNext;
      if ((long)iVar2 != 0) {
        ppNVar3[iVar2]->iPrev = iVar1;
      }
      if (p->pLists1[lVar4] == pVertex->Id) {
        p->pLists1[lVar4] = iVar2;
      }
    }
    else {
      if (p->pLists1[0x10] == 0) {
LAB_00496a1f:
        __assert_fail("*pList",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkMerge.c"
                      ,0xb7,"void Nwk_ManGraphListDelete(Nwk_Grf_t *, int *, Nwk_Vrt_t *)");
      }
      iVar1 = pVertex->iPrev;
      if ((long)iVar1 != 0) {
        ppNVar3[iVar1]->iNext = pVertex->iNext;
      }
      iVar2 = pVertex->iNext;
      if ((long)iVar2 != 0) {
        ppNVar3[iVar2]->iPrev = iVar1;
      }
      if (p->pLists1[0x10] == pVertex->Id) {
        p->pLists1[0x10] = iVar2;
      }
    }
  }
  else if (iVar1 < 0x10) {
    if (p->pLists2[lVar4] == 0) goto LAB_00496a1f;
    iVar1 = pVertex->iPrev;
    if ((long)iVar1 != 0) {
      p->pVerts[iVar1]->iNext = pVertex->iNext;
    }
    iVar2 = pVertex->iNext;
    if ((long)iVar2 != 0) {
      p->pVerts[iVar2]->iPrev = iVar1;
    }
    if (p->pLists2[lVar4] == pVertex->Id) {
      p->pLists2[lVar4] = iVar2;
    }
  }
  else {
    if (p->pLists2[0x10] == 0) goto LAB_00496a1f;
    iVar1 = pVertex->iPrev;
    if ((long)iVar1 != 0) {
      p->pVerts[iVar1]->iNext = pVertex->iNext;
    }
    iVar2 = pVertex->iNext;
    if ((long)iVar2 != 0) {
      p->pVerts[iVar2]->iPrev = iVar1;
    }
    if (p->pLists2[0x10] == pVertex->Id) {
      p->pLists2[0x10] = iVar2;
    }
  }
  pVertex->iNext = 0;
  pVertex->iPrev = 0;
  return;
}

Assistant:

static inline void Nwk_ManGraphListExtract( Nwk_Grf_t * p, Nwk_Vrt_t * pVertex )
{
    Nwk_Vrt_t * pNext;
    assert( pVertex->nEdges > 0 );

    if ( pVertex->nEdges == 1 )
    {
        pNext = p->pVerts[ pVertex->pEdges[0] ];
        if ( pNext->nEdges >= NWK_MAX_LIST )
            Nwk_ManGraphListDelete( p, p->pLists1 + NWK_MAX_LIST, pVertex );
        else
            Nwk_ManGraphListDelete( p, p->pLists1 + pNext->nEdges, pVertex );
    }
    else
    {
        if ( pVertex->nEdges >= NWK_MAX_LIST )
            Nwk_ManGraphListDelete( p, p->pLists2 + NWK_MAX_LIST, pVertex );
        else
            Nwk_ManGraphListDelete( p, p->pLists2 + pVertex->nEdges, pVertex );
    }
}